

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotShaded<unsigned_int>
               (char *label_id,uint *xs,uint *ys1,uint *ys2,int count,int offset,int stride)

{
  undefined1 local_70 [8];
  GetterXsYs<unsigned_int> getter2;
  GetterXsYs<unsigned_int> getter1;
  int offset_local;
  int count_local;
  uint *ys2_local;
  uint *ys1_local;
  uint *xs_local;
  char *label_id_local;
  
  GetterXsYs<unsigned_int>::GetterXsYs
            ((GetterXsYs<unsigned_int> *)&getter2.Stride,xs,ys1,count,offset,stride);
  GetterXsYs<unsigned_int>::GetterXsYs
            ((GetterXsYs<unsigned_int> *)local_70,xs,ys2,count,offset,stride);
  PlotShadedEx<ImPlot::GetterXsYs<unsigned_int>,ImPlot::GetterXsYs<unsigned_int>>
            (label_id,(GetterXsYs<unsigned_int> *)&getter2.Stride,
             (GetterXsYs<unsigned_int> *)local_70,true);
  return;
}

Assistant:

void PlotShaded(const char* label_id, const T* xs, const T* ys1, const T* ys2, int count, int offset, int stride) {
    GetterXsYs<T> getter1(xs, ys1, count, offset, stride);
    GetterXsYs<T> getter2(xs, ys2, count, offset, stride);
    PlotShadedEx(label_id, getter1, getter2, true);
}